

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_x86.cpp
# Opt level: O1

int __thiscall
ncnn::Padding_x86::forward_int8(Padding_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  _func_int *p_Var3;
  void *pvVar4;
  _func_int **pp_Var5;
  int *piVar6;
  bool bVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined1 uVar13;
  undefined1 uVar15;
  undefined1 uVar17;
  undefined1 uVar19;
  undefined8 uVar20;
  undefined4 uVar27;
  undefined1 uVar28;
  undefined1 uVar30;
  undefined1 uVar32;
  undefined1 uVar34;
  undefined8 uVar35;
  uint uVar42;
  int iVar43;
  ulong uVar44;
  uint uVar45;
  int iVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  undefined8 *puVar50;
  int iVar51;
  long lVar52;
  int iVar53;
  undefined8 *puVar54;
  undefined8 *puVar55;
  int iVar56;
  int iVar57;
  long lVar58;
  int iVar59;
  undefined8 *puVar60;
  long lVar61;
  long lVar62;
  int unaff_R13D;
  undefined8 *puVar63;
  bool bVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  Mat m;
  Mat m_1;
  Mat local_148;
  ulong local_f8;
  ulong local_f0;
  int local_e4;
  long local_e0;
  ulong local_d8;
  ulong local_d0;
  Mat local_c8;
  ulong local_78;
  ulong local_70;
  uint local_64;
  ulong local_60;
  size_t local_58;
  void *local_50;
  long local_48;
  ulong local_40;
  Mat *local_38;
  undefined4 uVar14;
  undefined3 uVar16;
  undefined2 uVar18;
  undefined1 uVar21;
  undefined1 uVar22;
  undefined3 uVar23;
  undefined1 uVar24;
  undefined2 uVar25;
  undefined1 uVar26;
  undefined4 uVar29;
  undefined3 uVar31;
  undefined2 uVar33;
  undefined1 uVar36;
  undefined1 uVar37;
  undefined3 uVar38;
  undefined1 uVar39;
  undefined2 uVar40;
  undefined1 uVar41;
  
  iVar43 = bottom_blob->elempack;
  if (iVar43 == 8) {
    local_d8 = (ulong)(uint)bottom_blob->w;
    local_70 = (ulong)(uint)bottom_blob->h;
    local_e4 = bottom_blob->d;
    uVar45 = bottom_blob->c;
    uVar48 = (ulong)uVar45;
    iVar1 = bottom_blob->dims;
    local_d0 = bottom_blob->elemsize;
    if (iVar1 == 1) {
      p_Var3 = this->_vptr_Padding_x86[-3];
      uVar42 = *(uint *)(&this->field_0xd8 + (long)p_Var3) + bottom_blob->w * 8 +
               *(int *)(&this->field_0xdc + (long)p_Var3);
      bVar64 = (uVar42 & 7) == 0;
      iVar56 = 1;
      if (bVar64) {
        iVar56 = 8;
      }
      bVar7 = true;
      if ((bVar64 && (*(uint *)(&this->field_0xd8 + (long)p_Var3) & 7) == 0) &&
         (*(int *)(&this->field_0xe0 + (long)p_Var3) == 0)) {
        Mat::create(top_blob,(int)uVar42 / iVar56,(local_d0 >> 3) << bVar64 * '\x03',iVar56,
                    opt->blob_allocator);
        unaff_R13D = -100;
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
          p_Var3 = this->_vptr_Padding_x86[-3];
          uVar47 = (ulong)*(float *)(&this->field_0xe4 + (long)p_Var3);
          iVar56 = *(int *)(&this->field_0xd8 + (long)p_Var3);
          iVar57 = *(int *)(&this->field_0xdc + (long)p_Var3);
          iVar53 = iVar56 + 7;
          if (-1 < iVar56) {
            iVar53 = iVar56;
          }
          iVar56 = iVar57 + 7;
          if (-1 < iVar57) {
            iVar56 = iVar57;
          }
          padding_constant_pack8_int8_sse
                    (bottom_blob,top_blob,0,0,iVar53 >> 3,iVar56 >> 3,
                     uVar47 << 0x38 | uVar47 << 0x30 | uVar47 << 0x28 |
                     uVar47 << 0x20 | uVar47 << 0x18 | uVar47 << 0x10 | uVar47 << 8 | uVar47);
          unaff_R13D = 0;
        }
        bVar7 = false;
      }
      if (!bVar7) {
        return unaff_R13D;
      }
    }
    if (iVar1 == 2) {
      p_Var3 = this->_vptr_Padding_x86[-3];
      uVar42 = *(uint *)(&this->field_0xd0 + (long)p_Var3) + (int)local_70 * 8 +
               *(int *)(&this->field_0xd4 + (long)p_Var3);
      bVar64 = (uVar42 & 7) == 0;
      iVar56 = 1;
      if (bVar64) {
        iVar56 = 8;
      }
      bVar7 = true;
      if ((bVar64 && (*(uint *)(&this->field_0xd0 + (long)p_Var3) & 7) == 0) &&
         (*(int *)(&this->field_0xe0 + (long)p_Var3) == 0)) {
        Mat::create(top_blob,*(int *)(&this->field_0xd8 + (long)p_Var3) + (int)local_d8 +
                             *(int *)(&this->field_0xdc + (long)p_Var3),(int)uVar42 / iVar56,
                    (local_d0 >> 3) << bVar64 * '\x03',iVar56,opt->blob_allocator);
        unaff_R13D = -100;
        if (top_blob->data == (void *)0x0) {
          bVar7 = false;
        }
        else {
          bVar7 = false;
          if ((long)top_blob->c * top_blob->cstep != 0) {
            p_Var3 = this->_vptr_Padding_x86[-3];
            uVar47 = (ulong)*(float *)(&this->field_0xe4 + (long)p_Var3);
            iVar56 = *(int *)(&this->field_0xd0 + (long)p_Var3);
            iVar57 = *(int *)(&this->field_0xd4 + (long)p_Var3);
            iVar53 = iVar56 + 7;
            if (-1 < iVar56) {
              iVar53 = iVar56;
            }
            iVar56 = iVar57 + 7;
            if (-1 < iVar57) {
              iVar56 = iVar57;
            }
            padding_constant_pack8_int8_sse
                      (bottom_blob,top_blob,iVar53 >> 3,iVar56 >> 3,
                       *(int *)(&this->field_0xd8 + (long)p_Var3),
                       *(int *)(&this->field_0xdc + (long)p_Var3),
                       uVar47 << 0x38 | uVar47 << 0x30 | uVar47 << 0x28 |
                       uVar47 << 0x20 | uVar47 << 0x18 | uVar47 << 0x10 | uVar47 << 8 | uVar47);
            unaff_R13D = 0;
            bVar7 = false;
          }
        }
      }
      if (!bVar7) {
        return unaff_R13D;
      }
    }
    if (iVar1 == 3) {
      p_Var3 = this->_vptr_Padding_x86[-3];
      uVar42 = *(uint *)(&this->field_0xe8 + (long)p_Var3) + uVar45 * 8 +
               *(int *)(&this->field_0xec + (long)p_Var3);
      bVar64 = (uVar42 & 7) == 0;
      iVar56 = 1;
      if (bVar64) {
        iVar56 = 8;
      }
      bVar7 = true;
      if (bVar64 && (*(uint *)(&this->field_0xe8 + (long)p_Var3) & 7) == 0) {
        if ((uVar42 == uVar45 * 8) || (*(int *)(&this->field_0xe0 + (long)p_Var3) == 0)) {
          iVar57 = (int)((long)(int)uVar42 / (long)iVar56);
          Mat::create(top_blob,*(int *)(&this->field_0xd8 + (long)p_Var3) + (int)local_d8 +
                               *(int *)(&this->field_0xdc + (long)p_Var3),
                      *(int *)(&this->field_0xd0 + (long)p_Var3) + (int)local_70 +
                      *(int *)(&this->field_0xd4 + (long)p_Var3),iVar57,
                      (local_d0 >> 3) << bVar64 * '\x03',iVar56,opt->blob_allocator);
          unaff_R13D = -100;
          if (top_blob->data == (void *)0x0) {
            bVar7 = false;
          }
          else {
            bVar7 = false;
            if ((long)top_blob->c * top_blob->cstep != 0) {
              iVar53 = *(int *)(&this->field_0xe8 + (long)this->_vptr_Padding_x86[-3]);
              iVar46 = iVar53 + 7;
              if (-1 < iVar53) {
                iVar46 = iVar53;
              }
              if (0 < iVar57) {
                uVar45 = -(iVar46 >> 3);
                local_40 = (long)(int)uVar42 / (long)iVar56 & 0xffffffff;
                uVar47 = 0;
                auVar69 = _DAT_0054e100;
                local_78 = uVar48;
                local_64 = uVar45;
                do {
                  local_148.w = top_blob->w;
                  local_148.h = top_blob->h;
                  local_148.c = top_blob->d;
                  pvVar4 = top_blob->data;
                  local_148.elemsize = top_blob->elemsize;
                  puVar63 = (undefined8 *)
                            (top_blob->cstep * uVar47 * local_148.elemsize + (long)pvVar4);
                  local_148.elempack = top_blob->elempack;
                  local_148.allocator = top_blob->allocator;
                  local_148.refcount._0_4_ = 0;
                  local_148.refcount._4_4_ = 0;
                  local_148.d = 1;
                  local_148.dims = top_blob->dims + -1;
                  local_148.cstep =
                       (local_148.elemsize * (long)local_148.h * (long)local_148.w + 0xf &
                       0xfffffffffffffff0) / local_148.elemsize;
                  if (top_blob->dims == 4) {
                    local_148.cstep = (long)local_148.h * (long)local_148.w;
                  }
                  p_Var3 = this->_vptr_Padding_x86[-3];
                  uVar44 = (ulong)*(float *)(&this->field_0xe4 + (long)p_Var3);
                  local_f8 = (ulong)uVar45;
                  uVar44 = uVar44 << 0x38 | uVar44 << 0x30 | uVar44 << 0x28 |
                           uVar44 << 0x20 | uVar44 << 0x18 | uVar44 << 0x10 | uVar44 << 8 | uVar44;
                  local_f0._0_4_ = (int)uVar47;
                  uVar42 = local_64 + (int)local_f0;
                  local_148.data = puVar63;
                  local_f0 = uVar47;
                  if ((int)uVar42 < 0 || (int)uVar48 <= (int)uVar42) {
                    uVar42 = local_148.c * (int)local_148.cstep;
                    if (0 < (int)uVar42) {
                      lVar58 = (ulong)uVar42 - 1;
                      auVar65._8_4_ = (int)lVar58;
                      auVar65._0_8_ = lVar58;
                      auVar65._12_4_ = (int)((ulong)lVar58 >> 0x20);
                      lVar58 = top_blob->cstep * local_148.elemsize * uVar47;
                      auVar65 = auVar65 ^ auVar69;
                      uVar47 = 0;
                      auVar68 = _DAT_0054e210;
                      do {
                        auVar67 = auVar68 ^ auVar69;
                        if ((bool)(~(auVar65._4_4_ < auVar67._4_4_ ||
                                    auVar65._0_4_ < auVar67._0_4_ && auVar67._4_4_ == auVar65._4_4_)
                                  & 1)) {
                          *(ulong *)((long)pvVar4 + uVar47 * 8 + lVar58) = uVar44;
                        }
                        if (auVar67._12_4_ <= auVar65._12_4_ &&
                            (auVar67._8_4_ <= auVar65._8_4_ || auVar67._12_4_ != auVar65._12_4_)) {
                          *(ulong *)((long)pvVar4 + uVar47 * 8 + lVar58 + 8) = uVar44;
                        }
                        uVar47 = uVar47 + 2;
                        lVar52 = auVar68._8_8_;
                        auVar68._0_8_ = auVar68._0_8_ + 2;
                        auVar68._8_8_ = lVar52 + 2;
                      } while ((uVar42 + 1 & 0xfffffffe) != uVar47);
                    }
                  }
                  else {
                    local_c8.w = bottom_blob->w;
                    local_e0 = (long)local_c8.w;
                    iVar56 = bottom_blob->h;
                    local_c8.c = bottom_blob->d;
                    local_50 = bottom_blob->data;
                    local_c8.elemsize = bottom_blob->elemsize;
                    local_58 = bottom_blob->cstep;
                    puVar50 = (undefined8 *)(uVar42 * local_58 * local_c8.elemsize + (long)local_50)
                    ;
                    local_c8.elempack = bottom_blob->elempack;
                    local_c8.allocator = bottom_blob->allocator;
                    local_c8.refcount._0_4_ = 0;
                    local_c8.refcount._4_4_ = 0;
                    local_c8.d = 1;
                    uVar48 = iVar56 * local_e0;
                    local_c8.dims = bottom_blob->dims + -1;
                    local_c8.cstep =
                         (local_c8.elemsize * uVar48 + 0xf & 0xfffffffffffffff0) / local_c8.elemsize
                    ;
                    if (bottom_blob->dims == 4) {
                      local_c8.cstep = uVar48;
                    }
                    local_60 = local_c8.elemsize;
                    if (*(int *)(&this->field_0xe0 + (long)p_Var3) == 0) {
                      local_c8.data = puVar50;
                      local_c8.h = iVar56;
                      padding_constant_pack8_int8_sse
                                (&local_c8,&local_148,*(int *)(&this->field_0xd0 + (long)p_Var3),
                                 *(int *)(&this->field_0xd4 + (long)p_Var3),
                                 *(int *)(&this->field_0xd8 + (long)p_Var3),
                                 *(int *)(&this->field_0xdc + (long)p_Var3),uVar44);
                      auVar69 = _DAT_0054e100;
                    }
                    pp_Var5 = this->_vptr_Padding_x86;
                    p_Var3 = pp_Var5[-3];
                    if (*(int *)(&this->field_0xe0 + (long)p_Var3) == 1) {
                      iVar57 = *(int *)(&this->field_0xd0 + (long)p_Var3);
                      iVar53 = *(int *)(&this->field_0xd4 + (long)p_Var3);
                      iVar46 = *(int *)(&this->field_0xd8 + (long)p_Var3);
                      iVar2 = *(int *)(&this->field_0xdc + (long)p_Var3);
                      puVar54 = puVar63;
                      if (0 < iVar57) {
                        lVar58 = local_58 * local_60 * local_f8;
                        iVar59 = 0;
                        do {
                          iVar51 = iVar46;
                          if (0 < iVar46) {
                            do {
                              *puVar54 = *puVar50;
                              puVar54 = puVar54 + 1;
                              iVar51 = iVar51 + -1;
                            } while (iVar51 != 0);
                          }
                          puVar55 = puVar50;
                          if (0 < (int)local_e0) {
                            lVar52 = 0;
                            lVar62 = 0;
                            do {
                              puVar54[lVar62] =
                                   *(undefined8 *)((long)local_50 + lVar62 * 8 + lVar58);
                              lVar62 = lVar62 + 1;
                              lVar52 = lVar52 + -8;
                            } while ((int)local_e0 != (int)lVar62);
                            puVar54 = (undefined8 *)((long)puVar54 - lVar52);
                            puVar55 = (undefined8 *)((long)local_50 + (lVar58 - lVar52));
                          }
                          iVar51 = iVar2;
                          if (0 < iVar2) {
                            do {
                              *puVar54 = puVar55[-1];
                              puVar54 = puVar54 + 1;
                              iVar51 = iVar51 + -1;
                            } while (iVar51 != 0);
                          }
                          iVar59 = iVar59 + 1;
                        } while (iVar59 != iVar57);
                      }
                      puVar55 = puVar50;
                      if (0 < iVar56) {
                        iVar57 = 0;
                        do {
                          iVar59 = iVar46;
                          if (0 < iVar46) {
                            do {
                              *puVar54 = *puVar55;
                              puVar54 = puVar54 + 1;
                              iVar59 = iVar59 + -1;
                            } while (iVar59 != 0);
                          }
                          if (0 < (int)local_e0) {
                            lVar58 = 0;
                            lVar52 = 0;
                            do {
                              puVar54[lVar52] = puVar55[lVar52];
                              lVar52 = lVar52 + 1;
                              lVar58 = lVar58 + -8;
                            } while ((int)local_e0 != (int)lVar52);
                            puVar54 = (undefined8 *)((long)puVar54 - lVar58);
                            puVar55 = (undefined8 *)((long)puVar55 - lVar58);
                          }
                          iVar59 = iVar2;
                          if (0 < iVar2) {
                            do {
                              *puVar54 = puVar55[-1];
                              puVar54 = puVar54 + 1;
                              iVar59 = iVar59 + -1;
                            } while (iVar59 != 0);
                          }
                          iVar57 = iVar57 + 1;
                        } while (iVar57 != iVar56);
                      }
                      if (0 < iVar53) {
                        puVar55 = puVar55 + -local_e0;
                        iVar57 = 0;
                        do {
                          iVar59 = iVar46;
                          if (0 < iVar46) {
                            do {
                              *puVar54 = *puVar55;
                              puVar54 = puVar54 + 1;
                              iVar59 = iVar59 + -1;
                            } while (iVar59 != 0);
                          }
                          puVar60 = puVar55;
                          if (0 < (int)local_e0) {
                            lVar52 = 0;
                            lVar58 = 0;
                            do {
                              puVar54[lVar58] = puVar55[lVar58];
                              lVar58 = lVar58 + 1;
                              lVar52 = lVar52 + -8;
                            } while ((int)local_e0 != (int)lVar58);
                            puVar54 = (undefined8 *)((long)puVar54 - lVar52);
                            puVar60 = (undefined8 *)((long)puVar55 - lVar52);
                          }
                          iVar59 = iVar2;
                          if (0 < iVar2) {
                            do {
                              *puVar54 = puVar60[-1];
                              puVar54 = puVar54 + 1;
                              iVar59 = iVar59 + -1;
                            } while (iVar59 != 0);
                          }
                          iVar57 = iVar57 + 1;
                        } while (iVar57 != iVar53);
                      }
                    }
                    p_Var3 = pp_Var5[-3];
                    if (*(int *)(&this->field_0xe0 + (long)p_Var3) == 2) {
                      iVar57 = *(int *)(&this->field_0xd0 + (long)p_Var3);
                      iVar53 = *(int *)(&this->field_0xd4 + (long)p_Var3);
                      uVar45 = *(uint *)(&this->field_0xd8 + (long)p_Var3);
                      lVar52 = (long)(int)uVar45;
                      uVar48 = (ulong)uVar45;
                      uVar42 = *(uint *)(&this->field_0xdc + (long)p_Var3);
                      uVar47 = (ulong)uVar42;
                      lVar58 = (long)(iVar57 * (int)local_e0);
                      if (iVar57 < 1) {
                        puVar50 = puVar50 + lVar58;
                      }
                      else {
                        lVar62 = local_58 * local_60 * local_f8;
                        lVar61 = lVar62 + lVar52 * 8 + lVar58 * 8 + (long)local_50;
                        puVar50 = (undefined8 *)(lVar62 + lVar58 * 8 + (long)local_50);
                        iVar46 = 0;
                        do {
                          if (0 < (int)uVar45) {
                            lVar58 = 0;
                            do {
                              *puVar63 = *(undefined8 *)(lVar61 + lVar58 * 8);
                              puVar63 = puVar63 + 1;
                              lVar58 = lVar58 + -1;
                            } while (-lVar58 != uVar48);
                          }
                          puVar54 = puVar50;
                          if (0 < (int)local_e0) {
                            lVar58 = 0;
                            lVar62 = 0;
                            do {
                              puVar63[lVar62] = puVar50[lVar62];
                              lVar62 = lVar62 + 1;
                              lVar58 = lVar58 + -8;
                            } while ((int)local_e0 != (int)lVar62);
                            puVar63 = (undefined8 *)((long)puVar63 - lVar58);
                            puVar54 = (undefined8 *)((long)puVar50 - lVar58);
                          }
                          if (0 < (int)uVar42) {
                            lVar58 = 0;
                            do {
                              *puVar63 = puVar54[lVar58 + -2];
                              puVar63 = puVar63 + 1;
                              lVar58 = lVar58 + -1;
                            } while (-lVar58 != uVar47);
                          }
                          puVar50 = puVar50 + -local_e0;
                          iVar46 = iVar46 + 1;
                          lVar61 = lVar61 + local_e0 * -8;
                        } while (iVar46 != iVar57);
                      }
                      if (0 < iVar56) {
                        iVar57 = 0;
                        do {
                          if (0 < (int)uVar45) {
                            lVar58 = 0;
                            do {
                              *puVar63 = puVar50[lVar52 + lVar58];
                              puVar63 = puVar63 + 1;
                              lVar58 = lVar58 + -1;
                            } while (-lVar58 != uVar48);
                          }
                          if (0 < (int)local_e0) {
                            lVar58 = 0;
                            lVar62 = 0;
                            do {
                              puVar63[lVar62] = puVar50[lVar62];
                              lVar62 = lVar62 + 1;
                              lVar58 = lVar58 + -8;
                            } while ((int)local_e0 != (int)lVar62);
                            puVar63 = (undefined8 *)((long)puVar63 - lVar58);
                            puVar50 = (undefined8 *)((long)puVar50 - lVar58);
                          }
                          if (0 < (int)uVar42) {
                            lVar58 = 0;
                            do {
                              *puVar63 = puVar50[lVar58 + -2];
                              puVar63 = puVar63 + 1;
                              lVar58 = lVar58 + -1;
                            } while (-lVar58 != uVar47);
                          }
                          iVar57 = iVar57 + 1;
                        } while (iVar57 != iVar56);
                      }
                      if (0 < iVar53) {
                        puVar54 = puVar50 + -(long)((int)local_e0 * 2);
                        puVar50 = puVar50 + (lVar52 - (int)local_e0 * 2);
                        iVar57 = 0;
                        do {
                          if (0 < (int)uVar45) {
                            lVar58 = 0;
                            do {
                              *puVar63 = puVar50[lVar58];
                              puVar63 = puVar63 + 1;
                              lVar58 = lVar58 + -1;
                            } while (-lVar58 != uVar48);
                          }
                          puVar55 = puVar54;
                          if (0 < (int)local_e0) {
                            lVar58 = 0;
                            lVar52 = 0;
                            do {
                              puVar63[lVar52] = puVar54[lVar52];
                              lVar52 = lVar52 + 1;
                              lVar58 = lVar58 + -8;
                            } while ((int)local_e0 != (int)lVar52);
                            puVar63 = (undefined8 *)((long)puVar63 - lVar58);
                            puVar55 = (undefined8 *)((long)puVar54 - lVar58);
                          }
                          if (0 < (int)uVar42) {
                            lVar58 = 0;
                            do {
                              *puVar63 = puVar55[lVar58 + -2];
                              puVar63 = puVar63 + 1;
                              lVar58 = lVar58 + -1;
                            } while (-lVar58 != uVar47);
                          }
                          puVar54 = puVar54 + -local_e0;
                          iVar57 = iVar57 + 1;
                          puVar50 = puVar50 + -local_e0;
                        } while (iVar57 != iVar53);
                      }
                    }
                    local_c8.cstep = 0;
                    local_c8.data = (void *)0x0;
                    local_c8.refcount._0_4_ = 0;
                    local_c8.refcount._4_4_ = 0;
                    local_c8.elemsize = 0;
                    local_c8.elempack = 0;
                    local_c8.dims = 0;
                    local_c8.w = 0;
                    local_c8.h = 0;
                    local_c8.d = 0;
                    local_c8.c = 0;
                    uVar45 = (uint)local_f8;
                    uVar48 = local_78;
                    local_48 = (long)iVar56;
                  }
                  piVar6 = (int *)CONCAT44(local_148.refcount._4_4_,local_148.refcount._0_4_);
                  if (piVar6 != (int *)0x0) {
                    LOCK();
                    *piVar6 = *piVar6 + -1;
                    UNLOCK();
                    if (*piVar6 == 0) {
                      if (local_148.allocator == (Allocator *)0x0) {
                        if ((undefined8 *)local_148.data != (undefined8 *)0x0) {
                          free(local_148.data);
                          uVar45 = (uint)local_f8;
                          auVar69 = _DAT_0054e100;
                        }
                      }
                      else {
                        (*(local_148.allocator)->_vptr_Allocator[3])();
                        uVar45 = (uint)local_f8;
                        auVar69 = _DAT_0054e100;
                      }
                    }
                  }
                  local_148.cstep = 0;
                  local_148.data = (void *)0x0;
                  local_148.refcount._0_4_ = 0;
                  local_148.refcount._4_4_ = 0;
                  local_148.elemsize = 0;
                  local_148.elempack = 0;
                  local_148.dims = 0;
                  local_148.w = 0;
                  local_148.h = 0;
                  local_148.d = 0;
                  local_148.c = 0;
                  uVar47 = local_f0 + 1;
                  uVar45 = uVar45 + 1;
                } while (uVar47 != local_40);
              }
              bVar7 = false;
              unaff_R13D = 0;
            }
          }
        }
      }
      if (!bVar7) {
        return unaff_R13D;
      }
    }
    if (iVar1 == 4) {
      p_Var3 = this->_vptr_Padding_x86[-3];
      iVar1 = *(int *)(&this->field_0xe0 + (long)p_Var3);
      if (iVar1 == 0) {
        uVar45 = *(int *)(&this->field_0xe8 + (long)p_Var3) + local_e4 +
                 *(int *)(&this->field_0xec + (long)p_Var3);
        Mat::create(top_blob,(int)local_d8 + *(int *)(&this->field_0xd8 + (long)p_Var3) +
                             *(int *)(&this->field_0xdc + (long)p_Var3),
                    (int)local_70 + *(int *)(&this->field_0xd0 + (long)p_Var3) +
                    *(int *)(&this->field_0xd4 + (long)p_Var3),uVar45,(int)uVar48,local_d0,8,
                    opt->blob_allocator);
        unaff_R13D = -100;
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
          if ((int)uVar48 < 1) {
            unaff_R13D = 0;
          }
          else {
            uVar47 = 0;
            auVar69 = _DAT_0054e100;
            local_78 = uVar48;
            local_38 = top_blob;
            do {
              if (0 < (int)uVar45) {
                uVar48 = (ulong)*(float *)(&this->field_0xe4 + (long)this->_vptr_Padding_x86[-3]);
                uVar48 = uVar48 << 0x38 | uVar48 << 0x30 | uVar48 << 0x28 |
                         uVar48 << 0x20 | uVar48 << 0x18 | uVar48 << 0x10 | uVar48 << 8 | uVar48;
                uVar44 = 0;
                do {
                  local_148.w = top_blob->w;
                  local_148.elemsize = top_blob->elemsize;
                  local_148.h = top_blob->h;
                  local_148.elempack = top_blob->elempack;
                  local_148.allocator = top_blob->allocator;
                  local_148.cstep = (long)local_148.h * (long)local_148.w;
                  local_148.data =
                       (void *)((long)top_blob->data +
                               uVar44 * local_148.elemsize * local_148.cstep +
                               top_blob->cstep * uVar47 * local_148.elemsize);
                  local_148.refcount._0_4_ = 0;
                  local_148.refcount._4_4_ = 0;
                  local_148.dims = 2;
                  local_148.d = 1;
                  local_148.c = 1;
                  uVar42 = (int)uVar44 -
                           *(int *)(&this->field_0xe8 + (long)this->_vptr_Padding_x86[-3]);
                  if ((int)uVar42 < 0 || local_e4 <= (int)uVar42) {
                    if (0 < (int)local_148.cstep) {
                      lVar58 = (local_148.cstep & 0xffffffff) - 1;
                      auVar66._8_4_ = (int)lVar58;
                      auVar66._0_8_ = lVar58;
                      auVar66._12_4_ = (int)((ulong)lVar58 >> 0x20);
                      auVar66 = auVar66 ^ auVar69;
                      uVar49 = 0;
                      auVar67 = _DAT_0054e210;
                      do {
                        auVar68 = auVar67 ^ auVar69;
                        if ((bool)(~(auVar66._4_4_ < auVar68._4_4_ ||
                                    auVar66._0_4_ < auVar68._0_4_ && auVar68._4_4_ == auVar66._4_4_)
                                  & 1)) {
                          *(ulong *)((long)local_148.data + uVar49 * 8) = uVar48;
                        }
                        if (auVar68._12_4_ <= auVar66._12_4_ &&
                            (auVar68._8_4_ <= auVar66._8_4_ || auVar68._12_4_ != auVar66._12_4_)) {
                          *(ulong *)((long)local_148.data + uVar49 * 8 + 8) = uVar48;
                        }
                        uVar49 = uVar49 + 2;
                        lVar58 = auVar67._8_8_;
                        auVar67._0_8_ = auVar67._0_8_ + 2;
                        auVar67._8_8_ = lVar58 + 2;
                      } while (((int)local_148.cstep + 1U & 0xfffffffe) != uVar49);
                    }
                  }
                  else {
                    local_c8.w = bottom_blob->w;
                    local_c8.h = bottom_blob->h;
                    local_c8.elemsize = bottom_blob->elemsize;
                    local_c8.elempack = bottom_blob->elempack;
                    local_c8.allocator = bottom_blob->allocator;
                    local_c8.cstep = (long)local_c8.h * (long)local_c8.w;
                    local_c8.data =
                         (void *)((long)bottom_blob->data +
                                 local_c8.cstep * local_c8.elemsize * (ulong)uVar42 +
                                 bottom_blob->cstep * uVar47 * local_c8.elemsize);
                    local_c8.refcount._0_4_ = 0;
                    local_c8.refcount._4_4_ = 0;
                    local_c8.dims = 2;
                    local_c8.d = 1;
                    local_c8.c = 1;
                    p_Var3 = this->_vptr_Padding_x86[-3];
                    padding_constant_pack8_int8_sse
                              (&local_c8,&local_148,*(int *)(&this->field_0xd0 + (long)p_Var3),
                               *(int *)(&this->field_0xd4 + (long)p_Var3),
                               *(int *)(&this->field_0xd8 + (long)p_Var3),
                               *(int *)(&this->field_0xdc + (long)p_Var3),uVar48);
                    auVar69 = _DAT_0054e100;
                    piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
                    if (piVar6 != (int *)0x0) {
                      LOCK();
                      *piVar6 = *piVar6 + -1;
                      UNLOCK();
                      if (*piVar6 == 0) {
                        if (local_c8.allocator == (Allocator *)0x0) {
                          if (local_c8.data != (void *)0x0) {
                            free(local_c8.data);
                            auVar69 = _DAT_0054e100;
                          }
                        }
                        else {
                          (*(local_c8.allocator)->_vptr_Allocator[3])();
                          auVar69 = _DAT_0054e100;
                        }
                      }
                    }
                    local_c8.cstep = 0;
                    local_c8.data = (void *)0x0;
                    local_c8.refcount._0_4_ = 0;
                    local_c8.refcount._4_4_ = 0;
                    local_c8.elemsize = 0;
                    local_c8.elempack = 0;
                    local_c8.dims = 0;
                    local_c8.w = 0;
                    local_c8.h = 0;
                    local_c8.d = 0;
                    local_c8.c = 0;
                    top_blob = local_38;
                  }
                  piVar6 = (int *)CONCAT44(local_148.refcount._4_4_,local_148.refcount._0_4_);
                  if (piVar6 != (int *)0x0) {
                    LOCK();
                    *piVar6 = *piVar6 + -1;
                    UNLOCK();
                    if (*piVar6 == 0) {
                      if (local_148.allocator == (Allocator *)0x0) {
                        if (local_148.data != (void *)0x0) {
                          free(local_148.data);
                          auVar69 = _DAT_0054e100;
                        }
                      }
                      else {
                        (*(local_148.allocator)->_vptr_Allocator[3])();
                        auVar69 = _DAT_0054e100;
                      }
                    }
                  }
                  uVar44 = uVar44 + 1;
                } while (uVar44 != uVar45);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != local_78);
            unaff_R13D = 0;
          }
        }
      }
      if (iVar1 == 0) {
        return unaff_R13D;
      }
    }
  }
  local_148.data = bottom_blob->data;
  piVar6 = bottom_blob->refcount;
  local_148.refcount._0_4_ = SUB84(piVar6,0);
  local_148.refcount._4_4_ = (undefined4)((ulong)piVar6 >> 0x20);
  local_148.elemsize = bottom_blob->elemsize;
  local_148.elempack = bottom_blob->elempack;
  local_148.allocator = bottom_blob->allocator;
  uVar8 = bottom_blob->dims;
  uVar9 = bottom_blob->w;
  uVar10 = bottom_blob->h;
  uVar11 = bottom_blob->d;
  local_148.c = bottom_blob->c;
  local_148.cstep = bottom_blob->cstep;
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + 1;
    UNLOCK();
  }
  local_148.dims = uVar8;
  local_148.w = uVar9;
  local_148.h = uVar10;
  local_148.d = uVar11;
  if (iVar43 != 1) {
    local_c8.data = *(void **)opt;
    local_c8.elemsize = (size_t)opt->workspace_allocator;
    uVar12 = opt->openmp_blocktime;
    uVar13 = opt->use_winograd_convolution;
    uVar15 = opt->use_sgemm_convolution;
    uVar17 = opt->use_int8_inference;
    uVar19 = opt->use_vulkan_compute;
    uVar18 = CONCAT11(uVar19,uVar17);
    uVar16 = CONCAT21(uVar18,uVar15);
    uVar14 = CONCAT31(uVar16,uVar13);
    local_c8.allocator = *(Allocator **)&opt->use_bf16_storage;
    uVar20._0_1_ = opt->use_shader_pack8;
    uVar20._1_1_ = opt->use_subgroup_basic;
    uVar20._2_1_ = opt->use_subgroup_vote;
    uVar20._3_1_ = opt->use_subgroup_ballot;
    uVar21 = opt->use_subgroup_shuffle;
    uVar22 = opt->use_image_storage;
    uVar24 = opt->use_tensor_storage;
    uVar26 = opt->use_reserved_0;
    uVar25 = CONCAT11(uVar26,uVar24);
    uVar23 = CONCAT21(uVar25,uVar22);
    uVar20._4_4_ = CONCAT31(uVar23,uVar21);
    uVar27 = opt->flush_denormals;
    uVar28 = opt->use_local_pool_allocator;
    uVar30 = opt->use_shader_local_memory;
    uVar32 = opt->use_cooperative_matrix;
    uVar34 = opt->use_winograd23_convolution;
    uVar33 = CONCAT11(uVar34,uVar32);
    uVar31 = CONCAT21(uVar33,uVar30);
    uVar29 = CONCAT31(uVar31,uVar28);
    uVar35._0_1_ = opt->use_winograd43_convolution;
    uVar35._1_1_ = opt->use_winograd63_convolution;
    uVar35._2_1_ = opt->use_reserved_6;
    uVar35._3_1_ = opt->use_reserved_7;
    uVar36 = opt->use_reserved_8;
    uVar37 = opt->use_reserved_9;
    uVar39 = opt->use_reserved_10;
    uVar41 = opt->use_reserved_11;
    uVar40 = CONCAT11(uVar41,uVar39);
    uVar38 = CONCAT21(uVar40,uVar37);
    uVar35._4_4_ = CONCAT31(uVar38,uVar36);
    local_c8.c = (int)uVar35;
    local_c8.dims = (int)uVar20;
    local_c8.refcount._0_4_ = SUB84(opt->workspace_allocator,0);
    local_c8.refcount._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    local_c8.elempack = uVar12;
    local_c8._28_4_ = uVar14;
    local_c8.w = uVar20._4_4_;
    local_c8.h = uVar27;
    local_c8.d = uVar29;
    local_c8._60_4_ = uVar35._4_4_;
    convert_packing(bottom_blob,&local_148,1,(Option *)&local_c8);
  }
  iVar43 = Padding::forward((Padding *)
                            ((long)&this->_vptr_Padding_x86 + (long)this->_vptr_Padding_x86[-3]),
                            &local_148,top_blob,opt);
  piVar6 = (int *)CONCAT44(local_148.refcount._4_4_,local_148.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_148.allocator == (Allocator *)0x0) {
        if (local_148.data != (void *)0x0) {
          free(local_148.data);
        }
      }
      else {
        (*(local_148.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar43;
}

Assistant:

int Padding_x86::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
    if (elempack == 8)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 8 == 0 ? 8 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int64_t v8 = (int64_t)value;
                int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);
                padding_constant_pack8_int8_sse(bottom_blob, top_blob, 0, 0, left / 8, right / 8, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 8 == 0 ? 8 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int64_t v8 = (int64_t)value;
                int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);
                padding_constant_pack8_int8_sse(bottom_blob, top_blob, top / 8, bottom / 8, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 8 == 0 ? 8 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 8 == 0 && out_elempack == 8 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    // TODO perchannel
                    //                     int64_t pad_value = per_channel_pad_data_size ? vld1_s8(per_channel_pad_data + q * 8) : vdup_n_s8((signed char)value);
                    int64_t v8 = (int64_t)value;
                    int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);

                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill<int64_t>(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack8_int8_sse(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack8_int8_sse(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack8_int8_sse(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    // TODO perchannel
                    //                     int64_t pad_value = per_channel_pad_data_size ? vld1_s8(per_channel_pad_data + q * 8) : vdup_n_s8((signed char)value);
                    int64_t v8 = (int64_t)value;
                    int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill<int64_t>(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack8_int8_sse(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
    }

    return Padding::forward(bottom_blob_unpacked, top_blob, opt);
}